

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.c
# Opt level: O2

int utf8_check_string(char *string,size_t length)

{
  size_t size;
  size_t sVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    if (length <= uVar2) {
      return 1;
    }
    size = utf8_check_first(string[uVar2]);
    if (size != 1) {
      if (size == 0) {
        return 0;
      }
      if (length - uVar2 < size) {
        return 0;
      }
      sVar1 = utf8_check_full(string + uVar2,size,(int32_t *)0x0);
      if (sVar1 == 0) {
        return 0;
      }
      uVar2 = (uVar2 + size) - 1;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

int utf8_check_string(const char *string, size_t length) {
    size_t i;

    for (i = 0; i < length; i++) {
        size_t count = utf8_check_first(string[i]);
        if (count == 0)
            return 0;
        else if (count > 1) {
            if (count > length - i)
                return 0;

            if (!utf8_check_full(&string[i], count, NULL))
                return 0;

            i += count - 1;
        }
    }

    return 1;
}